

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O0

bool operator>(CPubKey *a,CPubKey *b)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  byte *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 local_1a;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = true;
  if (*in_RDI <= *in_RSI) {
    local_1a = false;
    if (*in_RDI == *in_RSI) {
      uVar2 = CPubKey::size((CPubKey *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
                           );
      iVar3 = memcmp(in_RDI,in_RSI,(ulong)uVar2);
      local_1a = 0 < iVar3;
    }
    local_19 = local_1a;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool operator>(const CPubKey& a, const CPubKey& b)
    {
        return a.vch[0] > b.vch[0] ||
               (a.vch[0] == b.vch[0] && memcmp(a.vch, b.vch, a.size()) > 0);
    }